

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool wildcard_match_rec(char *wildcard,char *target)

{
  char cVar1;
  char firstbyte;
  bool bVar2;
  _Bool _Var3;
  size_t sVar4;
  size_t sVar5;
  byte unaff_BPL;
  
  do {
    cVar1 = *target;
    if (cVar1 == '\0') goto LAB_00140a2d;
    firstbyte = *wildcard;
    if (firstbyte == '\0') {
      unaff_BPL = 0;
      break;
    }
    sVar4 = GetUTF8Length(firstbyte);
    sVar5 = GetUTF8Length(cVar1);
    if (firstbyte == '?') {
LAB_00140a19:
      wildcard = wildcard + sVar4;
      target = target + sVar5;
      bVar2 = true;
    }
    else if (firstbyte == '*') {
      unaff_BPL = true;
      if ((wildcard[sVar4] != '\0') && (_Var3 = wildcard_match_rec(wildcard,target + sVar5), !_Var3)
         ) {
        unaff_BPL = wildcard_match_rec(wildcard + sVar4,target);
      }
      bVar2 = false;
    }
    else {
      if (firstbyte == cVar1) goto LAB_00140a19;
      bVar2 = false;
      unaff_BPL = 0;
    }
  } while (bVar2);
LAB_00140a40:
  return (_Bool)(unaff_BPL & 1);
LAB_00140a2d:
  do {
    cVar1 = *wildcard;
    wildcard = wildcard + 1;
  } while (cVar1 == '*');
  unaff_BPL = cVar1 == '\0';
  goto LAB_00140a40;
}

Assistant:

bool wildcard_match_rec(const char *wildcard, const char *target)
{
	const char *pw = wildcard;
	const char *pt = target;
	while (true)
	{
		if (*pt == '\0')
		{
			while (*pw != '\0')
			{
				if (*pw++ != '*')
				{
					return false;
				}
			}
			return true;
		}
		else if (*pw == '\0')
		{
			return false;
		}
		size_t w_skip = get_step_filechar((unsigned char *)pw);
		size_t t_skip = get_step_filechar((unsigned char *)pt);
		if (*pw == '*')
		{
			if (*(pw + w_skip) == '\0')
			{
				return true;
			}
			else if (wildcard_match_rec(pw, pt + t_skip))
			{
				return true;
			}
			else
			{
				return wildcard_match_rec(pw + w_skip, pt);
			}
		}
		else if (*pw == '?' || (*pw == *pt))
		{
			pw += w_skip;
			pt += t_skip;
			continue;
		}
		else
		{
			return false;
		}
	}
}